

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O0

uint32_t __thiscall
ymfm::pcm_registers::effective_rate(pcm_registers *this,uint32_t raw,uint32_t correction)

{
  uint32_t correction_local;
  uint32_t raw_local;
  pcm_registers *this_local;
  
  if (raw == 0) {
    this_local._4_4_ = 0;
  }
  else if (raw == 0xf) {
    this_local._4_4_ = 0x3f;
  }
  else {
    this_local._4_4_ = clamp(raw * 4 + correction,0,0x3f);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t pcm_registers::effective_rate(uint32_t raw, uint32_t correction)
{
	// raw rates of 0 and 15 just pin to min/max
	if (raw == 0)
		return 0;
	if (raw == 15)
		return 63;

	// otherwise add the correction and clamp to range
	return clamp(raw * 4 + correction, 0, 63);
}